

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O0

bool __thiscall
Amiga::Audio::Channel::output<(Amiga::Audio::Channel::State)3>(Channel *this,Channel *moduland)

{
  Channel *moduland_local;
  Channel *this_local;
  
  if (this->period_counter == 1) {
    this_local._7_1_ =
         transit<(Amiga::Audio::Channel::State)3,(Amiga::Audio::Channel::State)4>(this,moduland);
  }
  else {
    this->period_counter = this->period_counter - 1;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Audio::Channel::output<Audio::Channel::State::PlayingHigh>(Channel *moduland) {
	// This is a reasonable guess as to the exit condition for this node;
	// Commodore doesn't document.
	if(period_counter == 1) {
		return transit<State::PlayingHigh, State::PlayingLow>(moduland);
	}

	// percount.
	-- period_counter;

	return false;
}